

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

ReadResult * __thiscall
AsyncRgbLedAnalyzer::ReadBit(ReadResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  bool bVar1;
  int iVar2;
  U64 UVar3;
  ulong uVar4;
  pointer pAVar5;
  ostream *poVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ReadResult *result;
  BitTiming local_118;
  double local_e8;
  double lowTimeSec_1;
  double lowTimeSec;
  double local_b8;
  double nominalNegativeSec;
  int local_84;
  undefined1 local_80 [4];
  int minResetSamples;
  BitTiming local_50;
  double local_20;
  double highTimeSec;
  U64 fallingEdgeSample;
  AsyncRgbLedAnalyzer *this_local;
  
  fallingEdgeSample = (U64)this;
  ReadResult::ReadResult(__return_storage_ptr__);
  __return_storage_ptr__->mValid = false;
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  UVar3 = AnalyzerChannelData::GetSampleNumber();
  __return_storage_ptr__->mBeginSample = UVar3;
  AnalyzerChannelData::AdvanceToNextEdge();
  highTimeSec = (double)AnalyzerChannelData::GetSampleNumber();
  lVar7 = (long)highTimeSec - __return_storage_ptr__->mBeginSample;
  auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar9._0_8_ = lVar7;
  auVar9._12_4_ = 0x45300000;
  local_20 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / this->mSampleRateHz;
  if ((this->mFirstBitAfterReset & 1U) == 0) {
    pAVar5 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_50,pAVar5,BIT_LOW,(bool)(this->mDidDetectHighSpeed & 1));
    bVar1 = TimingTolerance::WithinTolerance(&local_50.mPositiveTiming,local_20);
    if (bVar1) {
      __return_storage_ptr__->mBitValue = BIT_LOW;
    }
    else {
      pAVar5 = std::
               unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      AsyncRgbLedAnalyzerSettings::DataTiming
                ((BitTiming *)local_80,pAVar5,BIT_HIGH,(bool)(this->mDidDetectHighSpeed & 1));
      bVar1 = TimingTolerance::WithinTolerance((TimingTolerance *)local_80,local_20);
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "positive pulse timing doesn\'t match detected speed mode");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mChannelData);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->mBitValue = BIT_HIGH;
    }
  }
  uVar4 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mChannelData);
  if ((uVar4 & 1) == 0) {
    pAVar5 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::ResetTiming((TimingTolerance *)&nominalNegativeSec,pAVar5);
    local_84 = (int)(nominalNegativeSec * this->mSampleRateHz);
    uVar4 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mChannelData);
    if ((uVar4 & 1) == 0) {
      if ((this->mFirstBitAfterReset & 1U) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "No complete bit between resets, can\'t decode");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return __return_storage_ptr__;
      }
      AnalyzerChannelData::Advance((uint)this->mChannelData);
      __return_storage_ptr__->mIsReset = true;
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar7 = AnalyzerChannelData::GetSampleNumber();
      __return_storage_ptr__->mEndSample = lVar7 - 1;
    }
    if ((__return_storage_ptr__->mIsReset & 1U) == 0) {
      if ((this->mFirstBitAfterReset & 1U) == 0) {
        lVar7 = __return_storage_ptr__->mEndSample - (long)highTimeSec;
        auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar11._0_8_ = lVar7;
        auVar11._12_4_ = 0x45300000;
        local_e8 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                   this->mSampleRateHz;
        pAVar5 = std::
                 unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ::operator->(&this->mSettings);
        AsyncRgbLedAnalyzerSettings::DataTiming
                  (&local_118,pAVar5,__return_storage_ptr__->mBitValue,
                   (bool)(this->mDidDetectHighSpeed & 1));
        bVar1 = TimingTolerance::WithinTolerance(&local_118.mNegativeTiming,local_e8);
        if (bVar1) {
          __return_storage_ptr__->mValid = true;
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "negative pulse timing doesn\'t match positive pulse");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          __return_storage_ptr__->mValid = false;
        }
      }
      else {
        lVar7 = __return_storage_ptr__->mEndSample - (long)highTimeSec;
        auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar10._0_8_ = lVar7;
        auVar10._12_4_ = 0x45300000;
        lowTimeSec_1 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                       this->mSampleRateHz;
        bVar1 = DetectSpeedMode(this,local_20,lowTimeSec_1,&__return_storage_ptr__->mBitValue);
        __return_storage_ptr__->mValid = bVar1;
      }
    }
    else {
      __return_storage_ptr__->mValid = true;
      pAVar5 = std::
               unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      AsyncRgbLedAnalyzerSettings::DataTiming
                ((BitTiming *)&lowTimeSec,pAVar5,__return_storage_ptr__->mBitValue,
                 (bool)(this->mDidDetectHighSpeed & 1));
      auVar12._8_4_ = (int)((ulong)highTimeSec >> 0x20);
      auVar12._0_8_ = highTimeSec;
      auVar12._12_4_ = 0x45300000;
      dVar8 = local_b8 * this->mSampleRateHz +
              (auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(highTimeSec,0)) - 4503599627370496.0);
      uVar4 = (ulong)dVar8;
      __return_storage_ptr__->mEndSample =
           uVar4 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
    }
  }
  else {
    AnalyzerChannelData::AdvanceToNextEdge();
    poVar6 = std::operator<<((ostream *)&std::cerr,"too show low pulse, invalid bit");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return __return_storage_ptr__;
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadBit() -> ReadResult
{
    ReadResult result;
    result.mValid = false;

    if( mChannelData->GetBitState() == BIT_LOW )
    {
        mChannelData->AdvanceToNextEdge();
    }

    result.mBeginSample = mChannelData->GetSampleNumber();
    mChannelData->AdvanceToNextEdge();
    const U64 fallingEdgeSample = mChannelData->GetSampleNumber();
    const double highTimeSec = ( fallingEdgeSample - result.mBeginSample ) / mSampleRateHz;

    if( mFirstBitAfterReset )
    {
        // we can't classify yet, need to wait until we have the low pulse timing
    }
    else
    {
        // clasify based on existing value
        // ensure consistency with previously detected speed setting
        if( mSettings->DataTiming( BIT_LOW, mDidDetectHighSpeed ).mPositiveTiming.WithinTolerance( highTimeSec ) )
        {
            result.mBitValue = BIT_LOW;
        }
        else if( mSettings->DataTiming( BIT_HIGH, mDidDetectHighSpeed ).mPositiveTiming.WithinTolerance( highTimeSec ) )
        {
            result.mBitValue = BIT_HIGH;
        }
        else
        {
            std::cerr << "positive pulse timing doesn't match detected speed mode" << std::endl;
            mChannelData->AdvanceToAbsPosition( fallingEdgeSample );
            return result; // invalid result, reset required
        }
    }

    // check for a too-short low timing
    if( mChannelData->WouldAdvancingCauseTransition( mMinimumLowDurationSec * mSampleRateHz ) )
    {
        mChannelData->AdvanceToNextEdge();
        std::cerr << "too show low pulse, invalid bit" << std::endl;
        return result; // invalid result, reset required
    }

    // check for a low period exceeding the minimum reset time
    // if we exceed that, this is a reset
    const int minResetSamples = static_cast<int>( mSettings->ResetTiming().mMinimumSec * mSampleRateHz );

    if( !mChannelData->WouldAdvancingCauseTransition( minResetSamples ) )
    {
        // if we see a single bit in between resets, we can't decode the speed,
        // but this is meaningless anyway, so return an error
        if( mFirstBitAfterReset )
        {
            std::cerr << "No complete bit between resets, can't decode" << std::endl;
            return result; // return invalid
        }

        mChannelData->Advance( minResetSamples );
        result.mIsReset = true;
    }
    else
    {
        // we saw a transition, let's see the timing
        mChannelData->AdvanceToNextEdge();

        // the -1 is so the end of this frame, and start of the next, don't
        // overlap.
        result.mEndSample = mChannelData->GetSampleNumber() - 1;
    }

    if( result.mIsReset )
    {
        // if this bit is also a reset, we can't check the low time since it
        // will exceed the maximums, but we still want to accept that case
        // as valid
        result.mValid = true;

        // use the nominal negative pulse timing for the frame ending.
        double nominalNegativeSec = mSettings->DataTiming( result.mBitValue, mDidDetectHighSpeed ).mNegativeTiming.mNominalSec;
        result.mEndSample = fallingEdgeSample + ( nominalNegativeSec * mSampleRateHz );
    }
    else if( mFirstBitAfterReset )
    {
        const double lowTimeSec = ( result.mEndSample - fallingEdgeSample ) / mSampleRateHz;
        // two-way classification. This is necessary because the the 0-data
        // positive pulse of low-speed mode can match the 1-data positive pulse
        // in high speed mode, for some controllers. Hence we need to correlate
        // the high and low times to detect the speed mode

        // this also sets mBitValue correct as a side-effect of the detection
        result.mValid = DetectSpeedMode( highTimeSec, lowTimeSec, result.mBitValue );
    }
    else
    {
        // already detected the speed mode, ensure consistency
        const double lowTimeSec = ( result.mEndSample - fallingEdgeSample ) / mSampleRateHz;

        if( mSettings->DataTiming( result.mBitValue, mDidDetectHighSpeed ).mNegativeTiming.WithinTolerance( lowTimeSec ) )
        {
            // we are good
            result.mValid = true;
        }
        else
        {
            // we could do further classification here on the error, eg speed mismatch,
            // or bit value mismatch
            std::cerr << "negative pulse timing doesn't match positive pulse" << std::endl;
            result.mValid = false;
        }
    }

    return result;
}